

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitGenericSelectionExpression
          (SyntaxDumper *this,GenericSelectionExpressionSyntax *node)

{
  ExpressionSyntax *pEVar1;
  GenericSelectionExpressionSyntax local_148 [56];
  SyntaxToken local_110 [56];
  GenericAssociationListSyntax *local_d8;
  GenericAssociationListSyntax *it;
  GenericSelectionExpressionSyntax local_98 [72];
  GenericSelectionExpressionSyntax local_50 [56];
  GenericSelectionExpressionSyntax *local_18;
  GenericSelectionExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (GenericSelectionExpressionSyntax *)this;
  traverseExpression(this,(ExpressionSyntax *)node);
  GenericSelectionExpressionSyntax::genericKeyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  GenericSelectionExpressionSyntax::openParenthesisToken(local_98);
  (**(code **)(*(long *)this + 0x2e8))(this,local_98,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_98);
  pEVar1 = GenericSelectionExpressionSyntax::expression(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar1);
  GenericSelectionExpressionSyntax::commaToken((GenericSelectionExpressionSyntax *)&it);
  (**(code **)(*(long *)this + 0x2e8))(this,(GenericSelectionExpressionSyntax *)&it,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)&it);
  for (local_d8 = GenericSelectionExpressionSyntax::associations(local_18);
      local_d8 != (GenericAssociationListSyntax *)0x0;
      local_d8 = *(GenericAssociationListSyntax **)(local_d8 + 0x10)) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(local_d8 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,local_110,local_18);
    psy::C::SyntaxToken::~SyntaxToken(local_110);
  }
  GenericSelectionExpressionSyntax::closeParenthesisToken(local_148);
  (**(code **)(*(long *)this + 0x2e8))(this,local_148,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_148);
  return Skip;
}

Assistant:

virtual Action visitGenericSelectionExpression(const GenericSelectionExpressionSyntax*  node) override
    {
        traverseExpression(node);
        terminal(node->genericKeyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->expression());
        terminal(node->commaToken(), node);
        for (auto it = node->associations(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }